

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void reset_weak_ref(JSRuntime *rt,JSObject *p)

{
  JSValue v;
  long in_RSI;
  JSMapState *s;
  JSMapRecord *mr_next;
  JSMapRecord *mr;
  void *in_stack_ffffffffffffffd8;
  JSValueUnion rt_00;
  long lVar1;
  JSValueUnion JVar2;
  
  for (lVar1 = *(long *)(in_RSI + 0x28); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x10)) {
    in_stack_ffffffffffffffd8 = *(void **)(lVar1 + 8);
    list_del((list_head *)(lVar1 + 0x28));
    list_del((list_head *)(lVar1 + 0x18));
  }
  JVar2.ptr = ((JSValueUnion *)(in_RSI + 0x28))->ptr;
  while (JVar2.ptr != (void *)0x0) {
    rt_00 = (JSValueUnion)((JSValueUnion *)((long)JVar2.ptr + 0x10))->ptr;
    v.tag = in_RSI;
    v.u.ptr = JVar2.ptr;
    JS_FreeValueRT((JSRuntime *)rt_00.ptr,v);
    js_free_rt((JSRuntime *)rt_00.ptr,in_stack_ffffffffffffffd8);
    JVar2 = rt_00;
  }
  *(undefined8 *)(in_RSI + 0x28) = 0;
  return;
}

Assistant:

static void reset_weak_ref(JSRuntime *rt, JSObject *p)
{
    JSMapRecord *mr, *mr_next;
    JSMapState *s;
    
    /* first pass to remove the records from the WeakMap/WeakSet
       lists */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr->next_weak_ref) {
        s = mr->map;
        assert(s->is_weak);
        assert(!mr->empty); /* no iterator on WeakMap/WeakSet */
        list_del(&mr->hash_link);
        list_del(&mr->link);
    }
    
    /* second pass to free the values to avoid modifying the weak
       reference list while traversing it. */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr_next) {
        mr_next = mr->next_weak_ref;
        JS_FreeValueRT(rt, mr->value);
        js_free_rt(rt, mr);
    }

    p->first_weak_ref = NULL; /* fail safe */
}